

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

bool __thiscall
Plan::RefreshDyndepDependents(Plan *this,DependencyScan *scan,Node *node,string *err)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  Node *node_00;
  Edge *this_00;
  bool bVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> dependents;
  _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  local_60;
  
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  UnmarkDependents(this,node,(set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)&local_60);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left == p_Var2) {
    bVar3 = true;
  }
  else {
    p_Var1 = &(this->want_)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      node_00 = *(Node **)(p_Var6 + 1);
      bVar3 = DependencyScan::RecomputeDirty(scan,node_00,err);
      if (!bVar3) {
        bVar3 = false;
        break;
      }
      if (node_00->dirty_ == true) {
        this_00 = node_00->in_edge_;
        if ((this_00 == (Edge *)0x0) || (this_00->outputs_ready_ == true)) {
          __assert_fail("edge && !edge->outputs_ready()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                        ,0x272,
                        "bool Plan::RefreshDyndepDependents(DependencyScan *, const Node *, string *)"
                       );
        }
        p_Var7 = (this->want_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var5 = &p_Var1->_M_header;
        if (p_Var7 == (_Base_ptr)0x0) {
LAB_001088e5:
          __assert_fail("want_e != want_.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                        ,0x274,
                        "bool Plan::RefreshDyndepDependents(DependencyScan *, const Node *, string *)"
                       );
        }
        do {
          if (*(Edge **)(p_Var7 + 1) >= this_00) {
            p_Var5 = p_Var7;
          }
          p_Var7 = (&p_Var7->_M_left)[*(Edge **)(p_Var7 + 1) < this_00];
        } while (p_Var7 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var5 == p_Var1) ||
           (this_00 < (Edge *)((_Rb_tree_header *)p_Var5)->_M_node_count)) goto LAB_001088e5;
        if (*(int *)((long)p_Var5 + 0x28) == 0) {
          *(undefined4 *)((long)p_Var5 + 0x28) = 1;
          this->wanted_edges_ = this->wanted_edges_ + 1;
          bVar4 = Edge::is_phony(this_00);
          if (!bVar4) {
            this->command_edges_ = this->command_edges_ + 1;
          }
        }
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var2);
  }
  std::_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  ::~_Rb_tree(&local_60);
  return bVar3;
}

Assistant:

bool Plan::RefreshDyndepDependents(DependencyScan* scan, const Node* node,
                                   string* err) {
  // Collect the transitive closure of dependents and mark their edges
  // as not yet visited by RecomputeDirty.
  set<Node*> dependents;
  UnmarkDependents(node, &dependents);

  // Update the dirty state of all dependents and check if their edges
  // have become wanted.
  for (set<Node*>::iterator i = dependents.begin();
       i != dependents.end(); ++i) {
    Node* n = *i;

    // Check if this dependent node is now dirty.  Also checks for new cycles.
    if (!scan->RecomputeDirty(n, err))
      return false;
    if (!n->dirty())
      continue;

    // This edge was encountered before.  However, we may not have wanted to
    // build it if the outputs were not known to be dirty.  With dyndep
    // information an output is now known to be dirty, so we want the edge.
    Edge* edge = n->in_edge();
    assert(edge && !edge->outputs_ready());
    map<Edge*, Want>::iterator want_e = want_.find(edge);
    assert(want_e != want_.end());
    if (want_e->second == kWantNothing) {
      want_e->second = kWantToStart;
      EdgeWanted(edge);
    }
  }
  return true;
}